

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  uint uVar2;
  xmlSchemaNodeInfoPtr *ppxVar3;
  xmlSchemaNodeInfoPtr __s;
  char *message;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  iVar1 = vctxt->depth;
  uVar2 = vctxt->sizeElemInfos;
  lVar6 = (long)(int)uVar2;
  if ((int)uVar2 < iVar1) {
    message = "inconsistent depth encountered";
LAB_0019ab1d:
    xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshElemInfo",message);
    goto LAB_0019ac35;
  }
  if (iVar1 < (int)uVar2) {
    __s = vctxt->elemInfos[iVar1];
    if (__s != (xmlSchemaNodeInfoPtr)0x0) {
      if (__s->localName == (xmlChar *)0x0) goto LAB_0019abfb;
      message = "elem info has not been cleared";
      goto LAB_0019ab1d;
    }
LAB_0019abd3:
    __s = (xmlSchemaNodeInfoPtr)(*xmlMalloc)(0x90);
    if (__s != (xmlSchemaNodeInfoPtr)0x0) {
      vctxt->elemInfos[vctxt->depth] = __s;
LAB_0019abfb:
      memset(__s,0,0x90);
      __s->nodeType = 1;
      __s->depth = vctxt->depth;
      vctxt->inode = __s;
      vctxt->nbAttrInfos = 0;
      return 0;
    }
  }
  else if ((int)uVar2 < 1) {
    uVar5 = 10;
LAB_0019ab90:
    ppxVar3 = (xmlSchemaNodeInfoPtr *)(*xmlRealloc)(vctxt->elemInfos,(ulong)uVar5 * 8);
    if (ppxVar3 != (xmlSchemaNodeInfoPtr *)0x0) {
      vctxt->elemInfos = ppxVar3;
      vctxt->sizeElemInfos = uVar5;
      for (; lVar6 < (long)(ulong)uVar5; lVar6 = lVar6 + 1) {
        vctxt->elemInfos[lVar6] = (xmlSchemaNodeInfoPtr)0x0;
      }
      goto LAB_0019abd3;
    }
  }
  else if (uVar2 < 1000000000) {
    uVar4 = uVar2 + 1 >> 1;
    uVar5 = uVar4 + uVar2;
    if (1000000000 - uVar4 < uVar2) {
      uVar5 = 1000000000;
    }
    goto LAB_0019ab90;
  }
  xmlSchemaVErrMemory(vctxt);
LAB_0019ac35:
  vctxt->inode = (xmlSchemaNodeInfoPtr)0x0;
  xmlSchemaInternalErr
            ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPushElem",
             "calling xmlSchemaGetFreshElemInfo()");
  return -1;
}

Assistant:

static int
xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)
{
    vctxt->inode = xmlSchemaGetFreshElemInfo(vctxt);
    if (vctxt->inode == NULL) {
	VERROR_INT("xmlSchemaValidatorPushElem",
	    "calling xmlSchemaGetFreshElemInfo()");
	return (-1);
    }
    vctxt->nbAttrInfos = 0;
    return (0);
}